

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void coda_XML_ParserFree(XML_Parser parser)

{
  OPEN_INTERNAL_ENTITY *pOVar1;
  TAG *pTVar2;
  OPEN_INTERNAL_ENTITY *openEntity;
  TAG *p;
  OPEN_INTERNAL_ENTITY *entityList;
  TAG *tagList;
  XML_Parser parser_local;
  
  if (parser == (XML_Parser)0x0) {
    return;
  }
  entityList = (OPEN_INTERNAL_ENTITY *)parser->m_tagStack;
  do {
    if (entityList == (OPEN_INTERNAL_ENTITY *)0x0) {
      if (parser->m_freeTagList == (TAG *)0x0) {
        p = (TAG *)parser->m_openInternalEntities;
        do {
          if (p == (TAG *)0x0) {
            if (parser->m_freeInternalEntities == (OPEN_INTERNAL_ENTITY *)0x0) {
              destroyBindings(parser->m_freeBindingList,parser);
              destroyBindings(parser->m_inheritedBindings,parser);
              poolDestroy(&parser->m_tempPool);
              poolDestroy(&parser->m_temp2Pool);
              (*(parser->m_mem).free_fcn)(parser->m_protocolEncodingName);
              if ((parser->m_isParamEntity == '\0') && (parser->m_dtd != (DTD *)0x0)) {
                dtdDestroy(parser->m_dtd,(parser->m_parentParser != (XML_Parser)0x0 ^ 0xffU) & 1,
                           &parser->m_mem);
              }
              (*(parser->m_mem).free_fcn)(parser->m_atts);
              (*(parser->m_mem).free_fcn)(parser->m_groupConnector);
              (*(parser->m_mem).free_fcn)(parser->m_buffer);
              (*(parser->m_mem).free_fcn)(parser->m_dataBuf);
              (*(parser->m_mem).free_fcn)(parser->m_nsAtts);
              (*(parser->m_mem).free_fcn)(parser->m_unknownEncodingMem);
              if (parser->m_unknownEncodingRelease != (_func_void_void_ptr *)0x0) {
                (*parser->m_unknownEncodingRelease)(parser->m_unknownEncodingData);
              }
              (*(parser->m_mem).free_fcn)(parser);
              return;
            }
            p = (TAG *)parser->m_freeInternalEntities;
            parser->m_freeInternalEntities = (OPEN_INTERNAL_ENTITY *)0x0;
          }
          pTVar2 = *(TAG **)&p->rawNameLength;
          (*(parser->m_mem).free_fcn)(p);
          p = pTVar2;
        } while( true );
      }
      entityList = (OPEN_INTERNAL_ENTITY *)parser->m_freeTagList;
      parser->m_freeTagList = (TAG *)0x0;
    }
    pOVar1 = (OPEN_INTERNAL_ENTITY *)entityList->internalEventPtr;
    (*(parser->m_mem).free_fcn)(entityList[1].entity);
    destroyBindings((BINDING *)entityList[2].internalEventPtr,parser);
    (*(parser->m_mem).free_fcn)(entityList);
    entityList = pOVar1;
  } while( true );
}

Assistant:

void XMLCALL
XML_ParserFree(XML_Parser parser) {
  TAG *tagList;
  OPEN_INTERNAL_ENTITY *entityList;
  if (parser == NULL)
    return;
  /* free m_tagStack and m_freeTagList */
  tagList = parser->m_tagStack;
  for (;;) {
    TAG *p;
    if (tagList == NULL) {
      if (parser->m_freeTagList == NULL)
        break;
      tagList = parser->m_freeTagList;
      parser->m_freeTagList = NULL;
    }
    p = tagList;
    tagList = tagList->parent;
    FREE(parser, p->buf);
    destroyBindings(p->bindings, parser);
    FREE(parser, p);
  }
  /* free m_openInternalEntities and m_freeInternalEntities */
  entityList = parser->m_openInternalEntities;
  for (;;) {
    OPEN_INTERNAL_ENTITY *openEntity;
    if (entityList == NULL) {
      if (parser->m_freeInternalEntities == NULL)
        break;
      entityList = parser->m_freeInternalEntities;
      parser->m_freeInternalEntities = NULL;
    }
    openEntity = entityList;
    entityList = entityList->next;
    FREE(parser, openEntity);
  }

  destroyBindings(parser->m_freeBindingList, parser);
  destroyBindings(parser->m_inheritedBindings, parser);
  poolDestroy(&parser->m_tempPool);
  poolDestroy(&parser->m_temp2Pool);
  FREE(parser, (void *)parser->m_protocolEncodingName);
#ifdef XML_DTD
  /* external parameter entity parsers share the DTD structure
     parser->m_dtd with the root parser, so we must not destroy it
  */
  if (! parser->m_isParamEntity && parser->m_dtd)
#else
  if (parser->m_dtd)
#endif /* XML_DTD */
    dtdDestroy(parser->m_dtd, (XML_Bool)! parser->m_parentParser,
               &parser->m_mem);
  FREE(parser, (void *)parser->m_atts);
#ifdef XML_ATTR_INFO
  FREE(parser, (void *)parser->m_attInfo);
#endif
  FREE(parser, parser->m_groupConnector);
  FREE(parser, parser->m_buffer);
  FREE(parser, parser->m_dataBuf);
  FREE(parser, parser->m_nsAtts);
  FREE(parser, parser->m_unknownEncodingMem);
  if (parser->m_unknownEncodingRelease)
    parser->m_unknownEncodingRelease(parser->m_unknownEncodingData);
  FREE(parser, parser);
}